

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

bool __thiscall mkvparser::CuePoint::Load(CuePoint *this,IMkvReader *pReader)

{
  long lVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  longlong lVar4;
  longlong lVar5;
  TrackPosition *pTVar6;
  TrackPosition *tp;
  TrackPosition *this_00;
  long pos;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long len;
  long local_50;
  longlong local_48;
  long local_40;
  longlong local_38;
  
  lVar1 = this->m_timecode;
  bVar3 = true;
  if (lVar1 < 0) {
    if (this->m_track_positions != (TrackPosition *)0x0) {
      __assert_fail("m_track_positions == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x8eb,"bool mkvparser::CuePoint::Load(IMkvReader *)");
    }
    if (this->m_track_positions_count != 0) {
      __assert_fail("m_track_positions_count == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x8ec,"bool mkvparser::CuePoint::Load(IMkvReader *)");
    }
    lVar4 = ReadID(pReader,-lVar1,&local_50);
    if (lVar4 == 0xbb) {
      lVar10 = local_50 - lVar1;
      local_48 = -lVar1;
      local_40 = lVar1;
      local_38 = ReadUInt(pReader,lVar10,&local_50);
      if (local_38 < 0) {
        __assert_fail("size >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x8fd,"bool mkvparser::CuePoint::Load(IMkvReader *)");
      }
      lVar10 = lVar10 + local_50;
      lVar1 = lVar10 + local_38;
      lVar8 = lVar10;
      if (local_38 != 0) {
        do {
          lVar4 = ReadID(pReader,lVar8,&local_50);
          if ((((lVar4 < 0) || (lVar8 = lVar8 + local_50, lVar1 < lVar8)) ||
              (lVar5 = ReadUInt(pReader,lVar8,&local_50), lVar5 < 0)) ||
             ((pos = lVar8 + local_50, lVar1 < pos || (lVar8 = pos + lVar5, lVar1 < lVar8))))
          goto LAB_001122e0;
          if (lVar4 == 0xb7) {
            this->m_track_positions_count = this->m_track_positions_count + 1;
          }
          else if (lVar4 == 0xb3) {
            lVar4 = UnserializeUInt(pReader,pos,lVar5);
            this->m_timecode = lVar4;
          }
        } while (lVar8 < lVar1);
      }
      if ((-1 < this->m_timecode) && (uVar9 = this->m_track_positions_count, uVar9 != 0)) {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar9;
        uVar7 = 0xffffffffffffffff;
        if (SUB168(auVar2 * ZEXT816(0x18),8) == 0) {
          uVar7 = SUB168(auVar2 * ZEXT816(0x18),0);
        }
        pTVar6 = (TrackPosition *)operator_new__(uVar7,(nothrow_t *)&std::nothrow);
        this->m_track_positions = pTVar6;
        if (pTVar6 != (TrackPosition *)0x0) {
          this_00 = pTVar6;
          if (local_38 != 0) {
            do {
              lVar4 = ReadID(pReader,lVar10,&local_50);
              if ((lVar4 < 0) || (lVar10 = lVar10 + local_50, lVar1 < lVar10)) goto LAB_001122e0;
              lVar5 = ReadUInt(pReader,lVar10,&local_50);
              if (lVar5 < 0) {
                __assert_fail("size >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                              ,0x943,"bool mkvparser::CuePoint::Load(IMkvReader *)");
              }
              lVar8 = lVar10 + local_50;
              if (lVar1 < lVar8) {
                __assert_fail("(pos + len) <= stop",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                              ,0x944,"bool mkvparser::CuePoint::Load(IMkvReader *)");
              }
              lVar10 = lVar8 + lVar5;
              if (lVar1 < lVar10) {
                __assert_fail("(pos + size) <= stop",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                              ,0x947,"bool mkvparser::CuePoint::Load(IMkvReader *)");
              }
              if (lVar4 == 0xb7) {
                bVar3 = TrackPosition::Parse(this_00,pReader,lVar8,lVar5);
                if (!bVar3) goto LAB_001122e0;
                this_00 = this_00 + 1;
              }
            } while (lVar10 < lVar1);
            pTVar6 = this->m_track_positions;
            uVar9 = this->m_track_positions_count;
          }
          if (((long)this_00 - (long)pTVar6 >> 3) * -0x5555555555555555 - uVar9 == 0) {
            this->m_element_start = local_48;
            this->m_element_size = lVar1 + local_40;
            return true;
          }
          __assert_fail("size_t(p - m_track_positions) == m_track_positions_count",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x955,"bool mkvparser::CuePoint::Load(IMkvReader *)");
        }
      }
    }
LAB_001122e0:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool CuePoint::Load(IMkvReader* pReader) {
  // odbgstream os;
  // os << "CuePoint::Load(begin): timecode=" << m_timecode << endl;

  if (m_timecode >= 0)  // already loaded
    return true;

  assert(m_track_positions == NULL);
  assert(m_track_positions_count == 0);

  long long pos_ = -m_timecode;
  const long long element_start = pos_;

  long long stop;

  {
    long len;

    const long long id = ReadID(pReader, pos_, len);
    if (id != libwebm::kMkvCuePoint)
      return false;

    pos_ += len;  // consume ID

    const long long size = ReadUInt(pReader, pos_, len);
    assert(size >= 0);

    pos_ += len;  // consume Size field
    // pos_ now points to start of payload

    stop = pos_ + size;
  }

  const long long element_size = stop - element_start;

  long long pos = pos_;

  // First count number of track positions

  while (pos < stop) {
    long len;

    const long long id = ReadID(pReader, pos, len);
    if ((id < 0) || (pos + len > stop)) {
      return false;
    }

    pos += len;  // consume ID

    const long long size = ReadUInt(pReader, pos, len);
    if ((size < 0) || (pos + len > stop)) {
      return false;
    }

    pos += len;  // consume Size field
    if ((pos + size) > stop) {
      return false;
    }

    if (id == libwebm::kMkvCueTime)
      m_timecode = UnserializeUInt(pReader, pos, size);

    else if (id == libwebm::kMkvCueTrackPositions)
      ++m_track_positions_count;

    pos += size;  // consume payload
  }

  if (m_timecode < 0 || m_track_positions_count <= 0) {
    return false;
  }

  // os << "CuePoint::Load(cont'd): idpos=" << idpos
  //   << " timecode=" << m_timecode
  //   << endl;

  m_track_positions = new (std::nothrow) TrackPosition[m_track_positions_count];
  if (m_track_positions == NULL)
    return false;

  // Now parse track positions

  TrackPosition* p = m_track_positions;
  pos = pos_;

  while (pos < stop) {
    long len;

    const long long id = ReadID(pReader, pos, len);
    if (id < 0 || (pos + len) > stop)
      return false;

    pos += len;  // consume ID

    const long long size = ReadUInt(pReader, pos, len);
    assert(size >= 0);
    assert((pos + len) <= stop);

    pos += len;  // consume Size field
    assert((pos + size) <= stop);

    if (id == libwebm::kMkvCueTrackPositions) {
      TrackPosition& tp = *p++;
      if (!tp.Parse(pReader, pos, size)) {
        return false;
      }
    }

    pos += size;  // consume payload
    if (pos > stop)
      return false;
  }

  assert(size_t(p - m_track_positions) == m_track_positions_count);

  m_element_start = element_start;
  m_element_size = element_size;

  return true;
}